

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::iterate
          (OuterEdgeVertexSetIndexIndependenceCase *this)

{
  ostringstream *poVar1;
  pointer *ppfVar2;
  TestLog *pTVar3;
  RenderContext *pRVar4;
  pointer pVVar5;
  pointer pOVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar13;
  long lVar14;
  MessageBuilder *this_00;
  _Link_type p_Var15;
  char *pcVar16;
  TestLog *pTVar17;
  long lVar18;
  deUint32 tfPrimTypeGL;
  int iVar19;
  uint *puVar20;
  int constantOuterLevelIndex;
  undefined8 extraout_RDX;
  undefined8 uVar21;
  _Rb_tree_node_base *b;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long lVar22;
  float *v;
  uint numPatches;
  OuterEdgeDescription *this_01;
  float *outerLevels;
  int vtxNdx;
  long lVar23;
  char *pcVar24;
  float constantOuterLevel;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  Vec3Set currentEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  RandomViewport viewport;
  Result tfResult;
  Vec3Set firstEdgeVertices;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  vector<float,_std::allocator<float>_> patchTessLevels;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  ostream local_250;
  VertexArrayBinding bindings [1];
  TFHandler tfHandler;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*pRVar4->_vptr_RenderContext[4])(pRVar4);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar10),0x10,0x10,dVar11);
  iVar10 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  lVar18 = CONCAT44(extraout_var_00,iVar10);
  dVar11 = (((this->m_program).m_ptr)->m_program).m_program;
  outerEdgeDescriptions(&edgeDescriptions,this->m_primitiveType);
  (**(code **)(lVar18 + 0x1680))(dVar11);
  (**(code **)(lVar18 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar18 + 0xfd8))(0x8e72);
  constantOuterLevel = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels(&patchTessLevels,0,constantOuterLevelIndex,constantOuterLevel);
  iVar10 = referenceVertexCount
                     (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                      (float *)CONCAT44(patchTessLevels.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        patchTessLevels.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_),
                      (float *)CONCAT44(patchTessLevels.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        patchTessLevels.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_) + 2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,iVar10);
  lVar18 = 0;
  uVar21 = extraout_RDX;
  do {
    if (lVar18 == 0xc) {
      bVar8 = false;
      break;
    }
    firstEdgeVertices._M_t._M_impl._0_1_ = 0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = 0;
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar13 = uVar7;
      pOVar6 = edgeDescriptions.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)(int)((ulong)((long)edgeDescriptions.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)edgeDescriptions.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if (lVar14 <= (long)uVar13) {
        bVar8 = false;
        goto LAB_0121fe81;
      }
      numPatches = (uint)uVar13;
      generatePatchTessLevels
                (&patchTessLevels_1,numPatches,(int)uVar21,iterate::singleOuterEdgeLevels[lVar18]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&patchTessLevels,"in_v_attr",(allocator<char> *)local_258);
      glu::va::Float(bindings,(string *)&patchTessLevels,1,
                     (int)((ulong)((long)patchTessLevels_1.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)patchTessLevels_1.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2),0,
                     patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&patchTessLevels);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar3,0);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar3 >> 0x20);
      ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar2);
      std::operator<<((ostream *)ppfVar2,"Testing with outer tessellation level ");
      this_00 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&patchTessLevels,
                           iterate::singleOuterEdgeLevels + lVar18);
      poVar1 = &this_00->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," for the ");
      this_01 = pOVar6 + uVar13;
      Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)local_258,this_01);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)local_258);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " edge, and with various levels for other edges");
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      tfPrimTypeGL = 0;
      if (this->m_usePointMode == false) {
        tfPrimTypeGL = 0xffffffff;
        if ((ulong)this->m_primitiveType < 3) {
          tfPrimTypeGL = *(deUint32 *)(&DAT_01890e10 + (ulong)this->m_primitiveType * 4);
        }
      }
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                (&tfResult,&tfHandler,dVar11,tfPrimTypeGL,1,bindings,
                 (int)((ulong)((long)patchTessLevels_1.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)patchTessLevels_1.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      outerLevels = patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
      uVar12 = referenceVertexCount
                         (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                          patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,outerLevels);
      iVar10 = (int)outerLevels;
      puVar20 = (uint *)0xc;
      if (uVar12 == (uint)(((long)tfResult.varying.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)tfResult.varying.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
        currentEdgeVertices._M_t._M_impl._0_1_ = 0;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        if ((int)uVar12 < 1) {
          uVar12 = 0;
        }
        lVar22 = 0;
        lVar23 = 0;
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pVVar5 = tfResult.varying.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar19 = (int)outerLevels;
          iVar10 = (int)puVar20;
          if ((ulong)uVar12 * 0xc - lVar22 == 0) break;
          v = (float *)((long)(tfResult.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22);
          bVar8 = OuterEdgeDescription::contains(this_01,(Vec3 *)v);
          if (bVar8) {
            if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = -1.0;
              if (numPatches < 4) {
                puVar20 = &switchD_0121f8f5::switchdataD_0188ff7c;
                switch(uVar13 & 0xffffffff) {
                default:
                  v = pVVar5[lVar23].m_data + 1;
                  break;
                case 1:
                case 3:
                  break;
                }
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = *v;
              }
              patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = 0;
              patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              pVar25 = std::
                       _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       ::_M_get_insert_unique_pos
                                 (&currentEdgeVertices._M_t,(key_type *)&patchTessLevels);
              b = pVar25.second;
              if (b != (_Rb_tree_node_base *)0x0) {
                bVar8 = true;
                if (&currentEdgeVertices._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)b
                    && pVar25.first == (_Rb_tree_node_base *)0x0) {
                  bVar8 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                                    ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)
                                     &patchTessLevels,(Vector<float,_3> *)(b + 1),
                                     (Vector<float,_3> *)b);
                }
                p_Var15 = std::
                          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ::_M_get_node(&currentEdgeVertices._M_t);
                tcu::Vector<float,_3>::Vector
                          ((Vector<float,_3> *)&p_Var15->_M_storage,
                           (Vector<float,_3> *)&patchTessLevels);
                puVar20 = (uint *)&currentEdgeVertices._M_t._M_impl.super__Rb_tree_header;
                std::_Rb_tree_insert_and_rebalance
                          (bVar8,&p_Var15->super__Rb_tree_node_base,b,(_Rb_tree_node_base *)puVar20)
                ;
                currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
              }
            }
            else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              if (numPatches == 2) {
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ =
                     *(undefined4 *)((long)pVVar5->m_data + lVar22);
                uVar21 = *(undefined8 *)((long)pVVar5->m_data + lVar22 + 4);
LAB_0121f9b8:
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_ = (undefined4)uVar21;
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = (float)((ulong)uVar21 >> 0x20);
              }
              else {
                if (numPatches == 1) {
                  patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_ =
                       *(undefined4 *)((long)pVVar5->m_data + lVar22 + 8);
                  uVar21 = *(undefined8 *)((long)pVVar5->m_data + lVar22);
                  goto LAB_0121f9b8;
                }
                if (numPatches == 0) {
                  tcu::Vector<float,_3>::Vector
                            ((Vector<float,_3> *)&patchTessLevels,(Vector<float,_3> *)v);
                }
                else {
                  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&patchTessLevels,-1.0);
                }
              }
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::insert(&currentEdgeVertices,(value_type *)&patchTessLevels);
            }
          }
          lVar23 = lVar23 + 1;
          lVar22 = lVar22 + 0xc;
        }
        if (uVar13 == 0) {
          bVar8 = true;
          std::
          set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::operator=(&firstEdgeVertices,&currentEdgeVertices);
        }
        else {
          bVar9 = std::operator!=(&currentEdgeVertices,&firstEdgeVertices);
          bVar8 = true;
          if (bVar9) {
            if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
              pcVar24 = "(x, 0)";
              if (numPatches != 1) {
                if (numPatches != 2) {
                  bVar8 = uVar13 == 3;
                  pcVar16 = "(x, 0)";
                  goto LAB_0121fbd5;
                }
                pcVar24 = "(y, 0)";
              }
            }
            else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              pcVar24 = "(y, x, z)";
              if (uVar13 != 1) {
                bVar8 = uVar13 == 2;
                pcVar16 = "(z, y, x)";
LAB_0121fbd5:
                pcVar24 = (char *)0x0;
                if (bVar8) {
                  pcVar24 = pcVar16;
                }
              }
            }
            else {
              pcVar24 = (char *)0x0;
            }
            local_258 = (undefined1  [8])pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
            std::operator<<(&local_250,"Failure: the set of vertices on the ");
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_278,this_01);
            std::operator<<(&local_250,(string *)&local_278);
            std::operator<<(&local_250," edge");
            std::operator<<(&local_250," doesn\'t match the set of vertices on the ");
            pOVar6 = edgeDescriptions.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_298,
                       edgeDescriptions.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            std::operator<<(&local_250,(string *)&local_298);
            std::operator<<(&local_250," edge");
            pTVar17 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_258,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar17,0);
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar17 >> 0x20);
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)
                       &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::operator<<((ostream *)
                            &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish,"Note: set of vertices on ");
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_2b8,this_01);
            ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            std::operator<<((ostream *)ppfVar2,(string *)&local_2b8);
            std::operator<<((ostream *)ppfVar2," edge, components swizzled like ");
            std::operator<<((ostream *)ppfVar2,pcVar24);
            std::operator<<((ostream *)ppfVar2," to match component order on first edge:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_2d8,(Functional *)&currentEdgeVertices,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar10,iVar19);
            ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            std::operator<<((ostream *)ppfVar2,(string *)&local_2d8);
            std::operator<<((ostream *)ppfVar2,"\non ");
            Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                      (&local_2f8,pOVar6);
            ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            std::operator<<((ostream *)ppfVar2,(string *)&local_2f8);
            std::operator<<((ostream *)ppfVar2," edge:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_318,(Functional *)&firstEdgeVertices,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar10,iVar19);
            std::operator<<((ostream *)
                            &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(string *)&local_318);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&patchTessLevels,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)
                       &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
            bVar8 = false;
          }
        }
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set(&currentEdgeVertices);
      }
      else {
        local_258 = (undefined1  [8])pTVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_250);
        std::operator<<(&local_250,
                        "Failure: the number of vertices returned by transform feedback is ");
        iVar19 = 0xc;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_250);
        std::operator<<(&local_250,", expected ");
        std::ostream::operator<<(&local_250,uVar12);
        pTVar17 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_258,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
        patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar17,0);
        patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pTVar17 >> 0x20);
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::operator<<((ostream *)
                        &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                       );
        containerStr<std::vector<float,std::allocator<float>>>
                  ((string *)&currentEdgeVertices,(Functional *)&patchTessLevels_1,
                   (vector<float,_std::allocator<float>_> *)0x6,iVar19,iVar10);
        std::operator<<((ostream *)
                        &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(string *)&currentEdgeVertices);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&patchTessLevels,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&currentEdgeVertices);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_250);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid set of vertices");
        bVar8 = false;
      }
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base(&tfResult.varying.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   );
      std::__cxx11::string::~string((string *)&bindings[0].binding.name);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>);
      uVar7 = uVar13 + 1;
      uVar21 = extraout_RDX_00;
    } while (bVar8);
    bVar8 = true;
LAB_0121fe81:
    std::
    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::~set(&firstEdgeVertices);
    lVar18 = lVar18 + 1;
    uVar21 = extraout_RDX_01;
  } while (lVar14 <= (long)uVar13);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
  if (!bVar8) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  std::
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ::~_Vector_base(&edgeDescriptions.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                 );
  return STOP;
}

Assistant:

OuterEdgeVertexSetIndexIndependenceCase::IterateResult OuterEdgeVertexSetIndexIndependenceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();
	const deUint32						programGL					= m_program->getProgram();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
			{
				typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

				Vec3Set firstEdgeVertices;

				for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
				{
					const OuterEdgeDescription&		edgeDesc			= edgeDescriptions[outerEdgeIndex];
					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
						const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

						if ((int)tfResult.varying.size() != refNumVertices)
						{
							log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
													<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
								<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
													<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
							return STOP;
						}

						{
							Vec3Set currentEdgeVertices;

							// Get the vertices on the current outer edge.
							for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
							{
								const Vec3& vtx = tfResult.varying[vtxNdx];
								if (edgeDesc.contains(vtx))
								{
									// Swizzle components to match the order of the first edge.
									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										currentEdgeVertices.insert(outerEdgeIndex == 0 ? vtx
																	: outerEdgeIndex == 1 ? vtx.swizzle(1, 0, 2)
																	: outerEdgeIndex == 2 ? vtx.swizzle(2, 1, 0)
																	: Vec3(-1.0f));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										currentEdgeVertices.insert(Vec3(outerEdgeIndex == 0 ? vtx.y()
																		: outerEdgeIndex == 1 ? vtx.x()
																		: outerEdgeIndex == 2 ? vtx.y()
																		: outerEdgeIndex == 3 ? vtx.x()
																		: -1.0f,
																		0.0f, 0.0f));
									}
									else
										DE_ASSERT(false);
								}
							}

							if (outerEdgeIndex == 0)
								firstEdgeVertices = currentEdgeVertices;
							else
							{
								// Compare vertices of this edge to those of the first edge.

								if (currentEdgeVertices != firstEdgeVertices)
								{
									const char* const swizzleDesc = m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)"
																													: outerEdgeIndex == 2 ? "(z, y, x)"
																													: DE_NULL)
																	: m_primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)"
																												: outerEdgeIndex == 2 ? "(y, 0)"
																												: outerEdgeIndex == 3 ? "(x, 0)"
																												: DE_NULL)
																	: DE_NULL;

									log << TestLog::Message << "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
															<< " doesn't match the set of vertices on the " << edgeDescriptions[0].description() << " edge" << TestLog::EndMessage
										<< TestLog::Message << "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
															<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
															<< "\non " << edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}